

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_humanize(char *p,int len,uint64_t v,lws_humanize_unit_t *schema)

{
  ulong uVar1;
  char **ppcVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  lws_humanize_unit_t *plVar6;
  char *pcVar7;
  
  plVar6 = schema + 1;
  while ((uVar1 = plVar6[-1].factor, v < uVar1 && (uVar1 != 1))) {
    ppcVar2 = &plVar6->name;
    plVar6 = plVar6 + 1;
    if (*ppcVar2 == (char *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/libwebsockets.c"
                    ,0x4a0,"int lws_humanize(char *, int, uint64_t, const lws_humanize_unit_t *)");
    }
  }
  pcVar5 = p + 1;
  *p = ' ';
  if (uVar1 == 1) {
    uVar3 = decim(pcVar5,v,'\x04','\0');
    pcVar5 = "%s    ";
    pcVar7 = p;
  }
  else {
    uVar3 = decim(pcVar5,v / plVar6[-1].factor,'\x04','\0');
    pcVar7 = pcVar5 + uVar3;
    pcVar5[uVar3] = '.';
    uVar3 = decim(pcVar5 + uVar3 + 1,(v % plVar6[-1].factor) / (plVar6[-1].factor / 1000),'\x03',
                  '\x01');
    pcVar5 = "%s";
  }
  iVar4 = lws_snprintf(pcVar7 + (ulong)uVar3 + 1,
                       (long)(((int)p + len) - (int)(pcVar7 + (ulong)uVar3 + 1)),pcVar5,
                       plVar6[-1].name);
  return iVar4;
}

Assistant:

int
lws_humanize(char *p, int len, uint64_t v, const lws_humanize_unit_t *schema)
{
	char *end = p + len;

	do {
		if (v >= schema->factor || schema->factor == 1) {
			if (schema->factor == 1) {
				*p++ = ' ';
				p += decim(p, v, 4, 0);
				return lws_snprintf(p, lws_ptr_diff(end, p),
						    "%s    ", schema->name);
			}

			*p++ = ' ';
			p += decim(p, v / schema->factor, 4, 0);
			*p++ = '.';
			p += decim(p, (v % schema->factor) /
					(schema->factor / 1000), 3, 1);

			return lws_snprintf(p, lws_ptr_diff(end, p),
					    "%s", schema->name);
		}
		schema++;
	} while (schema->name);

	assert(0);
	strncpy(p, "unknown value", len);

	return 0;
}